

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O2

grid_iterator<signed_char> * __thiscall
idx2::grid_iterator<signed_char>::operator++(grid_iterator<signed_char> *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  
  iVar2 = (this->S).field_0.field_0.X;
  iVar4 = (this->P).field_0.field_0.X + iVar2;
  (this->P).field_0.field_0.X = iVar4;
  pcVar5 = this->Ptr + iVar2;
  this->Ptr = pcVar5;
  iVar2 = (this->D).field_0.field_0.X;
  if (iVar2 <= iVar4) {
    (this->P).field_0.field_0.X = 0;
    iVar4 = (this->S).field_0.field_0.Y;
    iVar7 = (this->P).field_0.field_0.Y + iVar4;
    (this->P).field_0.field_0.Y = iVar7;
    lVar6 = (long)(this->N).field_0.field_0.X;
    this->Ptr = pcVar5 + (iVar4 * lVar6 - (long)iVar2);
    iVar3 = (this->D).field_0.field_0.Y;
    if (iVar3 <= iVar7) {
      (this->P).field_0.field_0.Y = 0;
      iVar7 = (this->S).field_0.field_0.Z;
      piVar1 = &(this->P).field_0.field_0.Z;
      *piVar1 = *piVar1 + iVar7;
      this->Ptr = pcVar5 + (iVar4 * lVar6 - (long)iVar2) +
                  ((long)(this->N).field_0.field_0.Y * iVar7 * lVar6 - iVar3 * lVar6);
    }
  }
  return this;
}

Assistant:

grid_iterator<t>&
grid_iterator<t>::operator++()
{
  P.X += S.X;
  Ptr += S.X;
  if (P.X >= D.X)
  {
    P.X = 0;
    P.Y += S.Y;
    Ptr = Ptr - D.X + (N.X * S.Y);
    if (P.Y >= D.Y)
    {
      P.Y = 0;
      P.Z += S.Z;
      Ptr = Ptr - D.Y * i64(N.X) + S.Z * i64(N.X) * N.Y;
    }
  }
  return *this;
}